

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O2

ssize_t __thiscall rest_rpc::rpc_client::write(rpc_client *this,int __fd,void *__buf,size_t __n)

{
  request_type rVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  reference pcVar4;
  ssize_t extraout_RAX;
  uint32_t uVar5;
  array<asio::const_buffer,_2UL> local_28;
  
  pcVar4 = std::
           _Deque_iterator<rest_rpc::rpc_client::client_message_type,_rest_rpc::rpc_client::client_message_type_&,_rest_rpc::rpc_client::client_message_type_*>
           ::operator[](&(this->outbox_).
                         super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
                         ._M_impl.super__Deque_impl_data._M_start,0);
  local_28._M_elems[1].size_ = (pcVar4->content).size_;
  uVar5 = (uint32_t)local_28._M_elems[1].size_;
  local_28._M_elems[1].size_ = local_28._M_elems[1].size_ & 0xffffffff;
  this->write_size_ = uVar5;
  rVar1 = pcVar4->req_type;
  uVar3 = pcVar4->req_id;
  uVar2 = pcVar4->func_id;
  local_28._M_elems[0].data_ = &this->header_;
  (this->header_).magic = '\'';
  (this->header_).req_type = rVar1;
  (this->header_).body_len = uVar5;
  (this->header_).req_id = uVar3;
  (this->header_).func_id = uVar2;
  local_28._M_elems[0].size_ = 0x14;
  local_28._M_elems[1].data_ = (pcVar4->content).data_;
  async_write<std::array<asio::const_buffer,2ul>,rest_rpc::rpc_client::write()::_lambda(std::error_code_const&,unsigned_long)_1_>
            (this,&local_28,(anon_class_8_1_8991fb9c_for_handler_)this);
  return extraout_RAX;
}

Assistant:

void write() {
    auto &msg = outbox_[0];
    write_size_ = (uint32_t)msg.content.length();
    std::array<asio::const_buffer, 2> write_buffers;
    header_ = {MAGIC_NUM, msg.req_type, write_size_, msg.req_id, msg.func_id};
    write_buffers[0] = asio::buffer(&header_, sizeof(rpc_header));
    write_buffers[1] = asio::buffer((char *)msg.content.data(), write_size_);

    async_write(write_buffers,
                [this](const asio::error_code &ec, const size_t length) {
                  if (ec) {
                    has_connected_ = false;
                    close(false);
                    error_callback(ec);

                    return;
                  }

                  std::unique_lock<std::mutex> lock(write_mtx_);
                  if (outbox_.empty()) {
                    return;
                  }

                  ::free((char *)outbox_.front().content.data());
                  outbox_.pop_front();

                  if (!outbox_.empty()) {
                    // more messages to send
                    this->write();
                  }
                });
  }